

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::ProgramFanoutBigProgram(void)

{
  int iVar1;
  mapped_type *pmVar2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> histogram;
  RE2 re1000;
  RE2 re100;
  RE2 re10;
  RE2 re1;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_538;
  LogMessageFatal local_508;
  RE2 local_388;
  RE2 local_2a8;
  RE2 local_1c8;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,"(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2::RE2(&local_1c8,"(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2::RE2(&local_2a8,"(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2::RE2(&local_388,"(?:(?:(?:(?:(?:.)?){1000})*)+)");
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_538._M_impl.super__Rb_tree_header._M_header;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_538._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_538._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = RE2::ProgramFanout(&local_e8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 3) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e2);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (3) == (re1.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  local_508.super_LogMessage.severity_ = 3;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,(key_type *)&local_508);
  if (*pmVar2 != 1) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e3);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (1) == (histogram[3])");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_1c8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 7) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e6);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (7) == (re10.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  local_508.super_LogMessage.severity_ = 7;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,(key_type *)&local_508);
  if (*pmVar2 != 10) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e7);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (10) == (histogram[7])");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_2a8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 10) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ea);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (10) == (re100.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  local_508.super_LogMessage.severity_ = 10;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,(key_type *)&local_508);
  if (*pmVar2 != 100) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1eb);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (100) == (histogram[10])");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_388,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 0xd) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ee);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (13) == (re1000.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  local_508.super_LogMessage.severity_ = 0xd;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,(key_type *)&local_508);
  if (*pmVar2 != 1000) {
    LogMessageFatal::LogMessageFatal
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ef);
    std::operator<<((ostream *)&local_508.super_LogMessage.str_,
                    "Check failed: (1000) == (histogram[13])");
    LogMessageFatal::~LogMessageFatal(&local_508);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&_Stack_538);
  RE2::~RE2(&local_388);
  RE2::~RE2(&local_2a8);
  RE2::~RE2(&local_1c8);
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(ProgramFanout, BigProgram) {
  RE2 re1("(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2 re10("(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2 re100("(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2 re1000("(?:(?:(?:(?:(?:.)?){1000})*)+)");

  map<int, int> histogram;

  // 3 is the largest non-empty bucket and has 1 element.
  CHECK_EQ(3, re1.ProgramFanout(&histogram));
  CHECK_EQ(1, histogram[3]);

  // 7 is the largest non-empty bucket and has 10 elements.
  CHECK_EQ(7, re10.ProgramFanout(&histogram));
  CHECK_EQ(10, histogram[7]);

  // 10 is the largest non-empty bucket and has 100 elements.
  CHECK_EQ(10, re100.ProgramFanout(&histogram));
  CHECK_EQ(100, histogram[10]);

  // 13 is the largest non-empty bucket and has 1000 elements.
  CHECK_EQ(13, re1000.ProgramFanout(&histogram));
  CHECK_EQ(1000, histogram[13]);
}